

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DArray.hpp
# Opt level: O3

bool __thiscall
Lib::
DArray<Lib::DArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::ensure(DArray<Lib::DArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *this,size_t s)

{
  ulong uVar1;
  DArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pDVar2;
  DArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *__s;
  ulong uVar3;
  ulong uVar4;
  DArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *res;
  
  uVar1 = this->_capacity;
  if (uVar1 < s) {
    uVar3 = uVar1 * 2;
    if (uVar3 < s || uVar3 - s == 0) {
      uVar3 = s;
    }
    uVar4 = uVar3 * 0x18 + 0xf & 0xfffffffffffffff0;
    if (uVar4 == 0) {
      __s = (DArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)FixedSizeAllocator<8UL>::alloc
                         ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
    }
    else if (uVar4 < 0x11) {
      __s = (DArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)FixedSizeAllocator<16UL>::alloc
                         ((FixedSizeAllocator<16UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
    }
    else if (uVar4 < 0x19) {
      __s = (DArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)FixedSizeAllocator<24UL>::alloc
                         ((FixedSizeAllocator<24UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
    }
    else if (uVar4 < 0x21) {
      __s = (DArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)FixedSizeAllocator<32UL>::alloc
                         ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
    }
    else if (uVar4 < 0x31) {
      __s = (DArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)FixedSizeAllocator<48UL>::alloc
                         ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
    }
    else if (uVar4 < 0x41) {
      __s = (DArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)FixedSizeAllocator<64UL>::alloc
                         ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
    }
    else {
      __s = (DArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)::operator_new(uVar4,0x10);
    }
    memset(__s,0,uVar3 * 0x18);
    if (this->_array !=
        (DArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        0x0) {
      array_delete<Lib::DArray<std::__cxx11::string>>(this->_array,this->_capacity);
      pDVar2 = this->_array;
      if (pDVar2 != (DArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0x0) {
        uVar4 = this->_capacity * 0x18 + 0xf & 0xfffffffffffffff0;
        if (uVar4 == 0) {
          pDVar2->_size = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
          GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pDVar2;
        }
        else if (uVar4 < 0x11) {
          pDVar2->_size = GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
          GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pDVar2;
        }
        else if (uVar4 < 0x19) {
          pDVar2->_size = GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
          GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pDVar2;
        }
        else if (uVar4 < 0x21) {
          pDVar2->_size = GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
          GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pDVar2;
        }
        else if (uVar4 < 0x31) {
          pDVar2->_size = GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
          GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pDVar2;
        }
        else if (uVar4 < 0x41) {
          pDVar2->_size = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
          GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pDVar2;
        }
        else {
          operator_delete(pDVar2,0x10);
        }
      }
    }
    this->_size = s;
    this->_capacity = uVar3;
    this->_array = __s;
  }
  else {
    this->_size = s;
  }
  return s <= uVar1;
}

Assistant:

inline bool ensure(size_t s)
  {
    if (_capacity >= s) {
      _size = s;
      return true;
    }

    size_t newCapacity = std::max(s, _capacity*2);

    void* mem = ALLOC_KNOWN(sizeof(C)*newCapacity,"DArray<>");
    C* newArray=array_new<C>(mem, newCapacity);

    if(_array) {
      array_delete(_array, _capacity);
      DEALLOC_KNOWN(_array,sizeof(C)*_capacity,"DArray<>");
    }
    _size = s;
    _capacity = newCapacity;
    _array = newArray;
    return false;
  }